

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O2

Scalar_conflict __thiscall draco::VectorD<long,_3>::AbsSum(VectorD<long,_3> *this)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if (lVar3 == 3) {
      return uVar2;
    }
    uVar1 = (this->v_)._M_elems[lVar3];
    uVar4 = -uVar1;
    if (0 < (long)uVar1) {
      uVar4 = uVar1;
    }
    if ((uVar4 ^ 0x7fffffffffffffff) < uVar2) break;
    uVar2 = uVar2 + uVar4;
    lVar3 = lVar3 + 1;
  }
  return 0x7fffffffffffffff;
}

Assistant:

Scalar AbsSum() const {
    Scalar result(0);
    for (int i = 0; i < dimension; ++i) {
      Scalar next_value = std::abs(v_[i]);
      if (result > std::numeric_limits<Scalar>::max() - next_value) {
        // Return the max if adding would have caused an overflow.
        return std::numeric_limits<Scalar>::max();
      }
      result += next_value;
    }
    return result;
  }